

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_x25519.cc
# Opt level: O1

int pkey_x25519_keygen(EVP_PKEY_CTX *ctx,EVP_PKEY *pkey)

{
  uint8_t *out_public_value;
  
  out_public_value = (uint8_t *)OPENSSL_malloc(0x41);
  if (out_public_value != (uint8_t *)0x0) {
    evp_pkey_set_method(pkey,&x25519_asn1_meth);
    X25519_keypair(out_public_value,out_public_value + 0x20);
    out_public_value[0x40] = '\x01';
    OPENSSL_free(pkey->pkey);
    pkey->pkey = out_public_value;
  }
  return (uint)(out_public_value != (uint8_t *)0x0);
}

Assistant:

static int pkey_x25519_keygen(EVP_PKEY_CTX *ctx, EVP_PKEY *pkey) {
  X25519_KEY *key =
      reinterpret_cast<X25519_KEY *>(OPENSSL_malloc(sizeof(X25519_KEY)));
  if (key == NULL) {
    return 0;
  }

  evp_pkey_set_method(pkey, &x25519_asn1_meth);

  X25519_keypair(key->pub, key->priv);
  key->has_private = 1;

  OPENSSL_free(pkey->pkey);
  pkey->pkey = key;
  return 1;
}